

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall Catch::Clara::Detail::BasicResult<void>::enforceOk(BasicResult<void> *this)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 8) != 0) {
    abort();
  }
  return;
}

Assistant:

void enforceOk() const override {

                    // Errors shouldn't reach this point, but if they do
                    // the actual error message will be in m_errorMessage
                    assert( m_type != ResultType::LogicError );
                    assert( m_type != ResultType::RuntimeError );
                    if ( m_type != ResultType::Ok )
                        std::abort();
                }